

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

size_t testing::internal::GetThreadCount(void)

{
  int iVar1;
  Message *pMVar2;
  long in_FS_OFFSET;
  __pid_t local_3c;
  Message local_38;
  undefined1 local_30 [8];
  string filename;
  
  filename.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  Message::Message(&local_38);
  pMVar2 = Message::operator<<(&local_38,(char (*) [7])"/proc/");
  local_3c = getpid();
  pMVar2 = Message::operator<<(pMVar2,&local_3c);
  pMVar2 = Message::operator<<(pMVar2,(char (*) [6])"/stat");
  Message::GetString_abi_cxx11_((string *)local_30,pMVar2);
  Message::~Message(&local_38);
  iVar1 = anon_unknown_91::ReadProcFileField<int>((string *)local_30,0x13);
  std::__cxx11::string::~string((string *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == filename.field_2._8_8_) {
    return (long)iVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}